

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void __thiscall
google::protobuf::SplitStringUsing
          (protobuf *this,StringPiece full,char *delim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  protobuf pVar1;
  size_t sVar2;
  size_type pos;
  size_type pos_00;
  protobuf *ppVar3;
  protobuf *ppVar4;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  string local_70;
  StringPiece local_50;
  StringPiece local_40;
  
  ppVar4 = (protobuf *)full.length_;
  local_50.length_ = (size_type)full.ptr_;
  pVar1 = *ppVar4;
  local_50.ptr_ = (char *)this;
  if ((pVar1 == (protobuf)0x0) || (ppVar4[1] != (protobuf)0x0)) {
    sVar2 = strlen((char *)ppVar4);
    if ((long)sVar2 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(sVar2,"string length exceeds max size");
    }
    s.length_ = sVar2;
    s.ptr_ = (char *)ppVar4;
    pos = stringpiece_internal::StringPiece::find_first_not_of(&local_50,s,0);
    if (pos != 0xffffffffffffffff) {
      do {
        sVar2 = strlen((char *)ppVar4);
        if ((long)sVar2 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (sVar2,"string length exceeds max size");
        }
        s_00.length_ = sVar2;
        s_00.ptr_ = (char *)ppVar4;
        pos_00 = stringpiece_internal::StringPiece::find_first_of(&local_50,s_00,pos);
        if (pos_00 == 0xffffffffffffffff) {
          local_40 = stringpiece_internal::StringPiece::substr(&local_50,pos,0xffffffffffffffff);
          stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_70,&local_40);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                     &local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == &local_70.field_2) {
            return;
          }
          operator_delete(local_70._M_dataplus._M_p);
          return;
        }
        local_40 = stringpiece_internal::StringPiece::substr(&local_50,pos,pos_00 - pos);
        stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_70,&local_40);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                   &local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        sVar2 = strlen((char *)ppVar4);
        if ((long)sVar2 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (sVar2,"string length exceeds max size");
        }
        s_01.length_ = sVar2;
        s_01.ptr_ = (char *)ppVar4;
        pos = stringpiece_internal::StringPiece::find_first_not_of(&local_50,s_01,pos_00);
      } while (pos != 0xffffffffffffffff);
    }
  }
  else if ((char *)local_50.length_ != (char *)0x0) {
    ppVar4 = (protobuf *)(local_50.length_ + (long)this);
    do {
      ppVar3 = this;
      if (*this == pVar1) {
        ppVar3 = this + 1;
      }
      else {
        do {
          ppVar3 = ppVar3 + 1;
          if (ppVar3 == ppVar4) break;
        } while (*ppVar3 != pVar1);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,this,ppVar3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                   &local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      this = ppVar3;
    } while (ppVar3 != ppVar4);
  }
  return;
}

Assistant:

void SplitStringUsing(StringPiece full, const char *delim,
                      std::vector<std::string> *result) {
  std::back_insert_iterator<std::vector<std::string> > it(*result);
  SplitStringToIteratorUsing(full, delim, it);
}